

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferTextureBufferRange.cpp
# Opt level: O1

void __thiscall
glcts::TextureBufferTextureBufferRange::fillInputData
          (TextureBufferTextureBufferRange *this,GLubyte *buffer,GLuint offset,FormatInfo *info)

{
  GLubyte *pGVar1;
  GLuint GVar2;
  byte bVar3;
  TestError *this_00;
  long lVar4;
  
  switch(info->m_input_type) {
  case 0x1400:
    if (info->m_n_components != 0) {
      lVar4 = 0;
      do {
        buffer[lVar4 + (ulong)offset] = '\x01';
        lVar4 = lVar4 + 1;
      } while ((uint)lVar4 < info->m_n_components);
    }
    break;
  case 0x1401:
    bVar3 = 0xff;
    if ((info->m_internal_format | 2) != 0x822b) {
      bVar3 = -(info->m_internal_format == 0x8058) | 1;
    }
    if (info->m_n_components != 0) {
      lVar4 = 0;
      do {
        buffer[lVar4 + (ulong)offset] = bVar3;
        lVar4 = lVar4 + 1;
      } while ((uint)lVar4 < info->m_n_components);
    }
    break;
  case 0x1402:
    GVar2 = info->m_n_components;
    if (GVar2 != 0) {
      lVar4 = 0;
      do {
        (buffer + lVar4 * 2 + (ulong)offset)[0] = '\x01';
        (buffer + lVar4 * 2 + (ulong)offset)[1] = '\0';
        lVar4 = lVar4 + 1;
      } while (GVar2 != (GLuint)lVar4);
    }
    break;
  case 0x1403:
    GVar2 = info->m_n_components;
    if (GVar2 != 0) {
      lVar4 = 0;
      do {
        (buffer + lVar4 * 2 + (ulong)offset)[0] = '\x01';
        (buffer + lVar4 * 2 + (ulong)offset)[1] = '\0';
        lVar4 = lVar4 + 1;
      } while (GVar2 != (GLuint)lVar4);
    }
    break;
  case 0x1404:
    if (info->m_n_components != 0) {
      lVar4 = 0;
      do {
        pGVar1 = buffer + lVar4 * 4 + (ulong)offset;
        pGVar1[0] = '\x01';
        pGVar1[1] = '\0';
        pGVar1[2] = '\0';
        pGVar1[3] = '\0';
        lVar4 = lVar4 + 1;
      } while ((uint)lVar4 < info->m_n_components);
    }
    break;
  case 0x1405:
    if (info->m_n_components != 0) {
      lVar4 = 0;
      do {
        pGVar1 = buffer + lVar4 * 4 + (ulong)offset;
        pGVar1[0] = '\x01';
        pGVar1[1] = '\0';
        pGVar1[2] = '\0';
        pGVar1[3] = '\0';
        lVar4 = lVar4 + 1;
      } while ((uint)lVar4 < info->m_n_components);
    }
    break;
  case 0x1406:
    GVar2 = info->m_n_components;
    if (GVar2 != 0) {
      lVar4 = 0;
      do {
        pGVar1 = buffer + lVar4 * 4 + (ulong)offset;
        pGVar1[0] = '\0';
        pGVar1[1] = '\0';
        pGVar1[2] = 0x80;
        pGVar1[3] = '?';
        lVar4 = lVar4 + 1;
      } while (GVar2 != (GLuint)lVar4);
    }
    break;
  default:
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Not allowed input type",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
               ,0x56b);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  case 0x140b:
    GVar2 = info->m_n_components;
    if (GVar2 != 0) {
      lVar4 = 0;
      do {
        (buffer + lVar4 * 2 + (ulong)offset)[0] = '\0';
        (buffer + lVar4 * 2 + (ulong)offset)[1] = '<';
        lVar4 = lVar4 + 1;
      } while (GVar2 != (GLuint)lVar4);
    }
  }
  return;
}

Assistant:

void TextureBufferTextureBufferRange::fillInputData(glw::GLubyte* buffer, glw::GLuint offset, FormatInfo& info)
{
	/* Initial value should give value equal to 1 on output */

	/* Check input data type */
	switch (info.get_input_type())
	{
	case GL_FLOAT:
	{
		glw::GLfloat* pointer = reinterpret_cast<glw::GLfloat*>(&buffer[offset]);
		for (glw::GLuint i = 0; i < info.get_n_components(); ++i)
		{
			*pointer++ = 1.0f;
		}
	}
	break;

	case GL_HALF_FLOAT:
	{
		glw::GLhalf* pointer = reinterpret_cast<glw::GLhalf*>(&buffer[offset]);

		glw::GLfloat val = 1.0f;

		/* Convert float to half float */
		glw::GLuint	temp32   = 0;
		glw::GLuint	temp32_2 = 0;
		unsigned short temp16   = 0;
		unsigned short temp16_2 = 0;

		memcpy(&temp32, &val, sizeof(glw::GLfloat));
		temp32_2 = temp32 >> 31;
		temp16   = (unsigned short)((temp32_2 >> 31) << 5);
		temp32_2 = temp32 >> 23;
		temp16_2 = temp32_2 & 0xff;
		temp16_2 = (unsigned short)((temp16_2 - 0x70) & ((glw::GLuint)((glw::GLint)(0x70 - temp16_2) >> 4) >> 27));
		temp16   = (unsigned short)((temp16 | temp16_2) << 10);
		temp32_2 = temp32 >> 13;
		temp16   = (unsigned short)(temp16 | (temp32_2 & 0x3ff));

		for (glw::GLuint i = 0; i < info.get_n_components(); ++i)
		{
			*pointer++ = temp16;
		}
	}
	break;

	case GL_UNSIGNED_BYTE:
	{
		glw::GLubyte* pointer = reinterpret_cast<glw::GLubyte*>(&buffer[offset]);
		glw::GLubyte  val	 = 0;

		/* Normalized Values */
		if (info.get_internal_format() == GL_R8 || info.get_internal_format() == GL_RG8 ||
			info.get_internal_format() == GL_RGBA8)
		{
			val = 255;
		}
		else
		{
			val = 1;
		}
		for (glw::GLuint i = 0; i < info.get_n_components(); ++i)
		{
			*pointer++ = val;
		}
	}
	break;

	case GL_UNSIGNED_SHORT:
	{
		glw::GLushort* pointer = reinterpret_cast<glw::GLushort*>(&buffer[offset]);

		for (glw::GLuint i = 0; i < info.get_n_components(); ++i)
		{
			*pointer++ = (glw::GLushort)1;
		}
	}
	break;
	case GL_UNSIGNED_INT:
	{
		glw::GLuint* pointer = reinterpret_cast<glw::GLuint*>(&buffer[offset]);

		for (glw::GLuint i = 0; i < info.get_n_components(); ++i)
		{
			*pointer++ = 1;
		}
	}
	break;
	case GL_INT:
	{
		glw::GLint* pointer = reinterpret_cast<glw::GLint*>(&buffer[offset]);
		for (glw::GLuint i = 0; i < info.get_n_components(); ++i)
		{
			*pointer++ = 1;
		}
	}
	break;
	case GL_SHORT:
	{
		glw::GLshort* pointer = reinterpret_cast<glw::GLshort*>(&buffer[offset]);
		for (glw::GLuint i = 0; i < info.get_n_components(); ++i)
		{
			*pointer++ = (glw::GLshort)1;
		}
	}
	break;
	case GL_BYTE:
	{
		glw::GLbyte* pointer = reinterpret_cast<glw::GLbyte*>(&buffer[offset]);
		for (glw::GLuint i = 0; i < info.get_n_components(); ++i)
		{
			*pointer++ = (glw::GLbyte)1;
		}
	}
	break;
	default:
		TCU_FAIL("Not allowed input type");
	}
}